

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Module::Module(Module *this,Store *param_1,ModuleDesc *desc)

{
  ImportType *pIVar1;
  pointer pEVar2;
  ImportDesc *import;
  ImportType *__args;
  ExportDesc *export_;
  pointer __args_00;
  
  (this->super_Object).kind_ = Module;
  *(undefined8 *)&(this->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Object).host_info_ = (void *)0x0;
  (this->super_Object).self_.index = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Module_001bb0e8;
  ModuleDesc::ModuleDesc(&this->desc_,desc);
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar1 = &((this->desc_).imports.
             super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish)->type;
  for (__args = &((this->desc_).imports.
                  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type; __args != pIVar1;
      __args = __args + 1) {
    std::vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>>::
    emplace_back<wabt::interp::ImportType&>
              ((vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>> *)
               &this->import_types_,__args);
  }
  pEVar2 = (this->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args_00 = (this->desc_).exports.
                   super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; __args_00 != pEVar2;
      __args_00 = __args_00 + 1) {
    std::vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>>::
    emplace_back<wabt::interp::ExportType&>
              ((vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>> *)
               &this->export_types_,&__args_00->type);
  }
  return;
}

Assistant:

Module::Module(Store&, ModuleDesc desc)
    : Object(skind), desc_(std::move(desc)) {
  for (auto&& import: desc_.imports) {
    import_types_.emplace_back(import.type);
  }

  for (auto&& export_: desc_.exports) {
    export_types_.emplace_back(export_.type);
  }
}